

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp3Codec.cpp
# Opt level: O0

uint8_t * MP3Codec::mp3FindFrame(uint8_t *buff,uint8_t *end)

{
  uint32_t uVar1;
  uint32_t *puStack_28;
  uint32_t header;
  uint8_t *cur;
  uint8_t *end_local;
  uint8_t *buff_local;
  
  puStack_28 = (uint32_t *)buff;
  if (buff != (uint8_t *)0x0) {
    for (; puStack_28 < end + -4; puStack_28 = (uint32_t *)((long)puStack_28 + 1)) {
      uVar1 = my_ntohl(*puStack_28);
      if (((((uVar1 & 0xffe00000) == 0xffe00000) && ((uVar1 & 0x60000) != 0)) &&
          ((uVar1 & 0xf000) != 0xf000)) && ((uVar1 & 0xc00) != 0xc00)) {
        return (uint8_t *)puStack_28;
      }
    }
  }
  return (uint8_t *)0x0;
}

Assistant:

uint8_t* MP3Codec::mp3FindFrame(uint8_t* buff, const uint8_t* end)
{
    if (buff == nullptr)
        return nullptr;
    // header
    for (uint8_t* cur = buff; cur < end - 4; cur++)
    {
        const uint32_t header = my_ntohl(*reinterpret_cast<uint32_t*>(cur));
        if ((header & 0xffe00000) != 0xffe00000)
            continue;
        // layer check
        if ((header & (3 << 17)) == 0)
            continue;
        // bit rate
        if ((header & (0xf << 12)) == 0xf << 12)
            continue;
        // frequency
        if ((header & (3 << 10)) == 3 << 10)
            continue;
        return cur;
    }
    return nullptr;
}